

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O2

void test_decimal128_from_string__zeros(void)

{
  _Bool _Var1;
  undefined8 uVar2;
  char *pcVar3;
  bson_decimal128_t negative_zero;
  bson_decimal128_t large_exponent;
  bson_decimal128_t exponent_zero;
  bson_decimal128_t zero;
  bson_decimal128_t bStack_48;
  bson_decimal128_t local_38;
  bson_decimal128_t local_28;
  bson_decimal128_t local_18;
  
  bson_decimal128_from_string("0",&local_18);
  bson_decimal128_from_string("0e-611",&local_28);
  bson_decimal128_from_string("0e+6000",&local_38);
  bson_decimal128_from_string("-0e-1",&bStack_48);
  _Var1 = decimal128_equal(&local_18,0x3040000000000000,0);
  if (_Var1) {
    _Var1 = decimal128_equal(&local_28,0x2b7a000000000000,0);
    if (_Var1) {
      _Var1 = decimal128_equal(&local_38,0x5f20000000000000,0);
      if (_Var1) {
        _Var1 = decimal128_equal(&bStack_48,0xb03e000000000000,0);
        if (_Var1) {
          return;
        }
        pcVar3 = "decimal128_equal ( &negative_zero, 0xb03e000000000000, 0x0000000000000000)";
        uVar2 = 0x21d;
      }
      else {
        pcVar3 = "decimal128_equal ( &large_exponent, 0x5f20000000000000, 0x0000000000000000)";
        uVar2 = 0x21b;
      }
    }
    else {
      pcVar3 = "decimal128_equal ( &exponent_zero, 0x2b7a000000000000, 0x0000000000000000)";
      uVar2 = 0x219;
    }
  }
  else {
    pcVar3 = "decimal128_equal (&zero, 0x3040000000000000, 0x0000000000000000)";
    uVar2 = 0x217;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
          ,uVar2,"test_decimal128_from_string__zeros",pcVar3);
  abort();
}

Assistant:

static void
test_decimal128_from_string__zeros (void)
{
   bson_decimal128_t zero;
   bson_decimal128_t exponent_zero;
   bson_decimal128_t large_exponent;
   bson_decimal128_t negative_zero;

   bson_decimal128_from_string ("0", &zero);
   bson_decimal128_from_string ("0e-611", &exponent_zero);
   bson_decimal128_from_string ("0e+6000", &large_exponent);
   bson_decimal128_from_string ("-0e-1", &negative_zero);

   BSON_ASSERT (decimal128_equal (&zero, 0x3040000000000000, 0x0000000000000000));
   BSON_ASSERT (decimal128_equal (
      &exponent_zero, 0x2b7a000000000000, 0x0000000000000000));
   BSON_ASSERT (decimal128_equal (
      &large_exponent, 0x5f20000000000000, 0x0000000000000000));
   BSON_ASSERT (decimal128_equal (
      &negative_zero, 0xb03e000000000000, 0x0000000000000000));
}